

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8556a::data<Imath_3_2::half>::setUpFrameBuffer
          (data<Imath_3_2::half> *this,
          vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *data,FrameBuffer *framebuf,
          Box2i *dw,bool dontbotherloadingdepth)

{
  int iVar1;
  int iVar2;
  Slice *pSVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  pointer pbVar12;
  Slice local_68 [56];
  
  iVar4 = (dw->max).x;
  iVar1 = (dw->min).x;
  iVar2 = (dw->max).y;
  iVar7 = (dw->min).y;
  lVar11 = (long)((iVar4 - iVar1) + 1);
  if (iVar2 < iVar7 || iVar4 < iVar1) {
    lVar11 = 1;
  }
  lVar8 = (long)((iVar2 - iVar7) + 1);
  if (iVar2 < iVar7 || iVar4 < iVar1) {
    lVar8 = 1;
  }
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::resize
            (data,lVar11 * ((long)(this->_channels).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->_channels).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) * lVar8);
  pbVar12 = (this->_channels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_channels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar12) {
    lVar8 = 0;
    lVar11 = 0;
    uVar10 = 0;
    do {
      if ((!dontbotherloadingdepth) ||
         ((iVar4 = std::__cxx11::string::compare
                             ((char *)((long)&(pbVar12->_M_dataplus)._M_p + lVar11)), iVar4 != 0 &&
          (iVar4 = std::__cxx11::string::compare
                             ((char *)((long)&(((this->_channels).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar11)), iVar4 != 0)))) {
        iVar4 = (dw->min).x;
        iVar1 = (dw->min).y;
        iVar2 = (dw->max).x;
        iVar7 = (iVar2 - iVar4) + 1;
        lVar9 = (long)iVar7 * 2;
        if ((dw->max).y < iVar1 || iVar2 < iVar4) {
          iVar7 = 1;
          lVar9 = 2;
        }
        pbVar12 = (this->_channels).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)(this->_channels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12;
        pSVar3 = *(Slice **)((long)&(pbVar12->_M_dataplus)._M_p + lVar11);
        uVar6 = lVar5 >> 4;
        Imf_3_2::Slice::Slice
                  (local_68,this->_type,
                   (char *)((long)(data->
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                           (lVar8 - (long)(iVar7 * iVar1 + iVar4) * uVar6)),uVar6,
                   (lVar5 >> 5) * lVar9,1,1,0.0,false,false);
        Imf_3_2::FrameBuffer::insert((char *)framebuf,pSVar3);
      }
      uVar10 = uVar10 + 1;
      pbVar12 = (this->_channels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x20;
      lVar8 = lVar8 + 2;
    } while (uVar10 < (ulong)((long)(this->_channels).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5)
            );
  }
  return;
}

Assistant:

void setUpFrameBuffer (
        vector<T>&   data,
        FrameBuffer& framebuf,
        const Box2i& dw,
        bool         dontbotherloadingdepth) const
    {

        // allocate enough space for all channels (even the depth channel)
        data.resize (
            _channels.size () * (dw.size ().x + 1) * (dw.size ().y + 1));
        for (size_t i = 0; i < _channels.size (); i++)
        {
            if (!dontbotherloadingdepth ||
                (_channels[i] != "Z" && _channels[i] != "ZBack"))
            {
                intptr_t base = reinterpret_cast<intptr_t> (&data[i]);
                framebuf.insert (
                    _channels[i].c_str (),
                    Slice (
                        _type,
                        reinterpret_cast<char*> (
                            base -
                            sizeof (T) *
                                (dw.min.x + dw.min.y * (dw.size ().x + 1)) *
                                _channels.size ()),
                        sizeof (T) * _channels.size (),
                        sizeof (T) * (dw.size ().x + 1) * _channels.size ()));
            }
        }
    }